

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::dht_tracker::sample_infohashes
          (dht_tracker *this,endpoint *ep,sha1_hash *target,
          function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
          *f)

{
  sa_family_t sVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Any_data local_70;
  code *local_60;
  address local_50;
  
  p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      sVar1 = (ep->impl_).data_.base.sa_family;
      aux::listen_socket_handle::get_external_address
                (&local_50,(listen_socket_handle *)(p_Var2 + 1));
      if ((sVar1 != 2) != (local_50.type_ == ipv4)) {
        ::std::
        function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
        ::function((function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
                    *)&local_70,f);
        dht::node::sample_infohashes
                  ((node *)&p_Var2[1]._M_left,ep,target,
                   (function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
                    *)&local_70);
        if (local_60 == (code *)0x0) {
          return;
        }
        (*local_60)(&local_70,&local_70,__destroy_functor);
        return;
      }
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void dht_tracker::sample_infohashes(udp::endpoint const& ep, sha1_hash const& target
		, std::function<void(node_id
			, time_duration
			, int, std::vector<sha1_hash>
			, std::vector<std::pair<sha1_hash, udp::endpoint>>)> f)
	{
		for (auto& n : m_nodes)
		{
			if (ep.protocol() != (n.first.get_external_address().is_v4() ? udp::v4() : udp::v6()))
				continue;
			n.second.dht.sample_infohashes(ep, target, f);
			break;
		}
	}